

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O0

Vec4 __thiscall
vkt::BindingModel::anon_unknown_1::TexelBufferInstanceBuffers::fetchTexelValue
          (TexelBufferInstanceBuffers *this,int fetchPosNdx)

{
  int y;
  int in_EDX;
  undefined4 in_register_00000034;
  Vec4 VVar1;
  undefined4 local_60;
  undefined4 local_58;
  ConstPixelBufferAccess *texelSrc;
  ConstPixelBufferAccess *texelSrcB;
  ConstPixelBufferAccess *texelSrcA;
  int fetchPosNdx_local;
  TexelBufferInstanceBuffers *this_local;
  
  local_60 = fetchPosNdx + 0x30;
  if (*(int *)CONCAT44(in_register_00000034,fetchPosNdx) == 1) {
    local_58 = 0x30;
  }
  else {
    local_58 = 0x58;
  }
  local_58 = fetchPosNdx + local_58;
  if (in_EDX % 2 != 0) {
    local_60 = local_58;
  }
  y = getFetchPos(in_EDX);
  VVar1 = tcu::ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)this,local_60,y,0);
  return (Vec4)VVar1.m_data;
}

Assistant:

tcu::Vec4 TexelBufferInstanceBuffers::fetchTexelValue (int fetchPosNdx) const
{
	// source order is ABAB
	const tcu::ConstPixelBufferAccess&	texelSrcA	= m_sourceViewA;
	const tcu::ConstPixelBufferAccess&	texelSrcB	= (m_numTexelBuffers == 1) ? (m_sourceViewA) : (m_sourceViewB);
	const tcu::ConstPixelBufferAccess&	texelSrc	= ((fetchPosNdx % 2) == 0) ? (texelSrcA) : (texelSrcB);

	return texelSrc.getPixel(getFetchPos(fetchPosNdx), 0, 0);
}